

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_common.hpp
# Opt level: O0

void __thiscall
spirv_cross::SPIRConstant::SPIRConstant
          (SPIRConstant *this,TypeID constant_type_,uint32_t *elements,uint32_t num_elements,
          bool specialized)

{
  TypedID<(spirv_cross::Types)3> local_3c;
  uint local_38;
  uint32_t i;
  byte local_25;
  uint32_t local_24;
  bool specialized_local;
  uint32_t *puStack_20;
  uint32_t num_elements_local;
  uint32_t *elements_local;
  SPIRConstant *this_local;
  TypeID constant_type__local;
  
  local_25 = specialized;
  local_24 = num_elements;
  puStack_20 = elements;
  elements_local = (uint32_t *)this;
  this_local._4_4_ = constant_type_.id;
  IVariant::IVariant(&this->super_IVariant);
  (this->super_IVariant)._vptr_IVariant = (_func_int **)&PTR__SPIRConstant_006d5200;
  *(uint32_t *)&(this->super_IVariant).field_0xc = this_local._4_4_;
  ConstantMatrix::ConstantMatrix(&this->m);
  this->specialization = (bool)(local_25 & 1);
  this->is_used_as_array_length = false;
  this->is_used_as_lut = false;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)3>,_8UL>::SmallVector(&this->subconstants);
  ::std::__cxx11::string::string((string *)&this->specialization_constant_macro_name);
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)3>,_8UL>::reserve
            (&this->subconstants,(ulong)local_24);
  for (local_38 = 0; local_38 < local_24; local_38 = local_38 + 1) {
    TypedID<(spirv_cross::Types)3>::TypedID(&local_3c,puStack_20[local_38]);
    SmallVector<spirv_cross::TypedID<(spirv_cross::Types)3>,_8UL>::push_back
              (&this->subconstants,&local_3c);
  }
  this->specialization = (bool)(local_25 & 1);
  return;
}

Assistant:

SPIRConstant(TypeID constant_type_, const uint32_t *elements, uint32_t num_elements, bool specialized)
	    : constant_type(constant_type_)
	    , specialization(specialized)
	{
		subconstants.reserve(num_elements);
		for (uint32_t i = 0; i < num_elements; i++)
			subconstants.push_back(elements[i]);
		specialization = specialized;
	}